

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

int uiEffectToFlag(UIEffect effect)

{
  UIEffect effect_local;
  int local_4;
  
  switch(effect) {
  case UI_General:
    local_4 = 1;
    break;
  case UI_AnimateMenu:
    local_4 = 2;
    break;
  case UI_FadeMenu:
    local_4 = 4;
    break;
  case UI_AnimateCombo:
    local_4 = 8;
    break;
  case UI_AnimateTooltip:
    local_4 = 0x10;
    break;
  case UI_FadeTooltip:
    local_4 = 0x20;
    break;
  case UI_AnimateToolBox:
    local_4 = 0x40;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int uiEffectToFlag(Qt::UIEffect effect)
{
    switch (effect) {
    case Qt::UI_General:
        return QPlatformTheme::GeneralUiEffect;
    case Qt::UI_AnimateMenu:
        return QPlatformTheme::AnimateMenuUiEffect;
    case Qt::UI_FadeMenu:
        return QPlatformTheme::FadeMenuUiEffect;
    case Qt::UI_AnimateCombo:
        return QPlatformTheme::AnimateComboUiEffect;
    case Qt::UI_AnimateTooltip:
        return QPlatformTheme::AnimateTooltipUiEffect;
    case Qt::UI_FadeTooltip:
        return QPlatformTheme::FadeTooltipUiEffect;
    case Qt::UI_AnimateToolBox:
        return QPlatformTheme::AnimateToolBoxUiEffect;
    }
    return 0;
}